

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

TPZVec<char> * __thiscall TPZVec<char>::operator=(TPZVec<char> *this,TPZVec<char> *rval)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  
  if (this != rval) {
    this->fNElements = rval->fNElements;
    if (this->fStore != (char *)0x0) {
      operator_delete__(this->fStore);
    }
    if (rval->fNAlloc == 0) {
      uVar1 = this->fNElements;
      pcVar2 = (char *)operator_new__(uVar1);
      this->fStore = pcVar2;
      if (0 < (long)uVar1) {
        lVar3 = 0;
        do {
          this->fStore[lVar3] = rval->fStore[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 < this->fNElements);
      }
    }
    else {
      this->fStore = rval->fStore;
    }
    this->fNAlloc = this->fNElements;
    rval->fStore = (char *)0x0;
    rval->fNElements = 0;
    rval->fNAlloc = 0;
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}